

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::
Animatable<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>::get
          (Animatable<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
           *this,double t,
          vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *v,
          TimeSampleInterpolationType tinerp)

{
  bool bVar1;
  
  if ((v != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0) &&
     (this->_blocked == false)) {
    if ((NAN(t)) && (this->_has_value == true)) {
      ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::operator=
                (v,&this->_value);
      return true;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      bVar1 = TypedTimeSamples<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
              ::
              get<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>,_nullptr>
                        (&this->_ts,v,t,tinerp);
      return bVar1;
    }
    if (this->_has_value == true) {
      bVar1 = get_scalar(this,v);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }